

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> * __thiscall
sqlite_orm::internal::
table_t<relive::KeyValue,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::get_table_info(vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>
                 *__return_storage_ptr__,
                table_t<relive::KeyValue,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
                *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compositeKeyColumnNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::reserve
            (__return_storage_ptr__,2);
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)__return_storage_ptr__;
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&local_38,
             &(this->columns).
              super__Tuple_impl<0UL,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
              .
              super__Head_base<0UL,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_sqlite_orm::constraints::primary_key_t<>_>,_false>
              ._M_head_impl);
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&local_38,
             (column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&this->columns);
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<table_info> get_table_info() const {
        std::vector<table_info> res;
        res.reserve(size_t(this->columns_count));
        this->for_each_column([&res](auto &col) {
          std::string dft;
          using field_type = typename std::decay<decltype(col)>::type::field_type;
          if(auto d = col.default_value()) {
              dft = *d;
          }
          table_info i{
              -1,
              col.name,
              type_printer<field_type>().print(),
              col.not_null(),
              dft,
              col.template has<constraints::primary_key_t<>>(),
          };
          res.emplace_back(i);
        });
        auto compositeKeyColumnNames = this->composite_key_columns_names();
        for(size_t i = 0; i < compositeKeyColumnNames.size(); ++i) {
            auto &columnName = compositeKeyColumnNames[i];
            auto it = std::find_if(res.begin(), res.end(), [&columnName](const table_info &ti) {
              return ti.name == columnName;
            });
            if(it != res.end()) {
                it->pk = static_cast<int>(i + 1);
            }
        }
        return res;
    }